

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexUtils.cpp
# Opt level: O3

void Ptex::v2_2::PtexUtils::reduceu
               (void *src,int sstride,int uw,int vw,void *dst,int dstride,DataType dt,int nchan)

{
  void *pvVar1;
  uint16_t uVar2;
  void *pvVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  void *pvVar9;
  
  switch(dt) {
  case dt_uint8:
    if (vw * sstride != 0) {
      pvVar3 = (void *)((long)(vw * sstride) + (long)src);
      iVar4 = uw * nchan;
      lVar7 = (long)nchan;
      do {
        pvVar9 = src;
        if (iVar4 != 0) {
          pvVar9 = (void *)((long)src + (long)iVar4);
          do {
            if (nchan != 0) {
              lVar8 = 0;
              do {
                *(char *)((long)dst + lVar8) =
                     (char)((uint)*(byte *)((long)src + lVar7 + lVar8) +
                            (uint)*(byte *)((long)src + lVar8) >> 1);
                lVar8 = lVar8 + 1;
              } while (lVar8 != lVar7);
              dst = (void *)((long)dst + lVar8);
              src = (void *)((long)src + lVar7);
            }
            src = (void *)((long)src + lVar7);
          } while (src != pvVar9);
        }
        dst = (void *)((long)dst + (long)(dstride - iVar4 / 2));
        src = (void *)((long)pvVar9 + (long)(sstride - iVar4));
      } while (src != pvVar3);
    }
    break;
  case dt_uint16:
    iVar4 = vw * (sstride / 2);
    if (iVar4 != 0) {
      pvVar3 = (void *)((long)src + (long)iVar4 * 2);
      iVar4 = uw * nchan;
      lVar7 = (long)nchan;
      do {
        pvVar9 = src;
        if (iVar4 != 0) {
          pvVar9 = (void *)((long)src + (long)iVar4 * 2);
          do {
            if (nchan != 0) {
              pvVar1 = (void *)((long)src + lVar7 * 2);
              lVar8 = 0;
              do {
                *(short *)((long)dst + lVar8) =
                     (short)((uint)*(ushort *)((long)pvVar1 + lVar8) +
                             (uint)*(ushort *)((long)src + lVar8) >> 1);
                lVar8 = lVar8 + 2;
              } while (lVar8 != lVar7 * 2);
              dst = (void *)((long)dst + lVar8);
              src = pvVar1;
            }
            src = (void *)((long)src + lVar7 * 2);
          } while (src != pvVar9);
        }
        src = (void *)((long)pvVar9 + (long)(sstride / 2 - iVar4) * 2);
        dst = (void *)((long)dst + (long)(dstride / 2 - iVar4 / 2) * 2);
      } while (src != pvVar3);
    }
    break;
  case dt_half:
    iVar4 = vw * (sstride / 2);
    if (iVar4 != 0) {
      pvVar3 = (void *)((long)src + (long)iVar4 * 2);
      iVar4 = uw * nchan;
      lVar7 = (long)nchan;
      do {
        pvVar9 = src;
        if (iVar4 != 0) {
          pvVar9 = (void *)((long)src + (long)iVar4 * 2);
          do {
            if (nchan != 0) {
              pvVar1 = (void *)((long)src + lVar7 * 2);
              lVar8 = 0;
              do {
                uVar2 = PtexHalf::fromFloat((*(float *)(PtexHalf::h2fTable +
                                                       (ulong)*(ushort *)((long)src + lVar8) * 4) +
                                            *(float *)(PtexHalf::h2fTable +
                                                      (ulong)*(ushort *)((long)pvVar1 + lVar8) * 4))
                                            * 0.5);
                *(uint16_t *)((long)dst + lVar8) = uVar2;
                lVar8 = lVar8 + 2;
              } while (lVar8 != lVar7 * 2);
              dst = (void *)((long)dst + lVar8);
              src = pvVar1;
            }
            src = (void *)((long)src + lVar7 * 2);
          } while (src != pvVar9);
        }
        src = (void *)((long)pvVar9 + (long)(sstride / 2 - iVar4) * 2);
        dst = (void *)((long)dst + (long)(dstride / 2 - iVar4 / 2) * 2);
      } while (src != pvVar3);
    }
    break;
  case dt_float:
    iVar4 = sstride + 3;
    if (-1 < sstride) {
      iVar4 = sstride;
    }
    iVar5 = vw * (iVar4 >> 2);
    if (iVar5 != 0) {
      pvVar3 = (void *)((long)src + (long)iVar5 * 4);
      iVar6 = uw * nchan;
      iVar5 = dstride + 3;
      if (-1 < dstride) {
        iVar5 = dstride;
      }
      lVar7 = (long)nchan;
      do {
        pvVar9 = src;
        if (iVar6 != 0) {
          pvVar9 = (void *)((long)src + (long)iVar6 * 4);
          do {
            if (nchan != 0) {
              pvVar1 = (void *)((long)src + lVar7 * 4);
              lVar8 = 0;
              do {
                *(float *)((long)dst + lVar8) =
                     (*(float *)((long)src + lVar8) + *(float *)((long)pvVar1 + lVar8)) * 0.5;
                lVar8 = lVar8 + 4;
              } while (lVar8 != lVar7 * 4);
              dst = (void *)((long)dst + lVar8);
              src = pvVar1;
            }
            src = (void *)((long)src + lVar7 * 4);
          } while (src != pvVar9);
        }
        src = (void *)((long)pvVar9 + (long)((iVar4 >> 2) - iVar6) * 4);
        dst = (void *)((long)dst + (long)((iVar5 >> 2) - iVar6 / 2) * 4);
      } while (src != pvVar3);
    }
  }
  return;
}

Assistant:

void reduceu(const void* src, int sstride, int uw, int vw,
             void* dst, int dstride, DataType dt, int nchan)
{
    switch (dt) {
    case dt_uint8:     reduceu(static_cast<const uint8_t*>(src), sstride, uw, vw,
                               static_cast<uint8_t*>(dst), dstride, nchan); break;
    case dt_half:      reduceu(static_cast<const PtexHalf*>(src), sstride, uw, vw,
                               static_cast<PtexHalf*>(dst), dstride, nchan); break;
    case dt_uint16:    reduceu(static_cast<const uint16_t*>(src), sstride, uw, vw,
                               static_cast<uint16_t*>(dst), dstride, nchan); break;
    case dt_float:     reduceu(static_cast<const float*>(src), sstride, uw, vw,
                               static_cast<float*>(dst), dstride, nchan); break;
    }
}